

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O2

UChar * __thiscall
icu_63::TZGNCore::getPartialLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *mzID,UBool isLong,
          UnicodeString *mzDisplayName)

{
  UBool UVar1;
  int32_t iVar2;
  UChar *key_00;
  undefined8 *key_01;
  int *value;
  UErrorCode status;
  PartialLocationKey key;
  UnicodeString location;
  UnicodeString name;
  UnicodeString usCountryCode;
  
  key.tzID = ZoneMeta::findTimeZoneID(tzCanonicalID);
  key.mzID = ZoneMeta::findMetaZoneID(mzID);
  key.isLong = isLong;
  key_00 = (UChar *)uhash_get_63(this->fPartialLocationNamesMap,&key);
  if (key_00 == (UChar *)0x0) {
    location.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    location.fUnion.fStackFields.fLengthAndFlags = 2;
    usCountryCode.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)&PTR__UnicodeString_003a7268;
    usCountryCode.fUnion.fStackFields.fLengthAndFlags = 2;
    ZoneMeta::getCanonicalCountry(tzCanonicalID,&usCountryCode,(UBool *)0x0);
    if ((ushort)usCountryCode.fUnion.fStackFields.fLengthAndFlags < 0x20) {
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                (this->fTimeZoneNames,tzCanonicalID,&location);
      if ((ushort)location.fUnion.fStackFields.fLengthAndFlags < 0x20) {
        UnicodeString::setTo(&location,tzCanonicalID);
      }
    }
    else {
      if (-1 < usCountryCode.fUnion.fStackFields.fLengthAndFlags) {
        usCountryCode.fUnion.fFields.fLength =
             (int)usCountryCode.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      iVar2 = UnicodeString::extract
                        (&usCountryCode,0,usCountryCode.fUnion.fFields.fLength,(char *)&status,4,
                         kInvariant);
      *(undefined1 *)((long)&status + (long)iVar2) = 0;
      name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
      name.fUnion.fStackFields.fLengthAndFlags = 2;
      (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])(this->fTimeZoneNames,mzID,&status);
      UVar1 = UnicodeString::operator==(tzCanonicalID,&name);
      if (UVar1 == '\0') {
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xb])
                  (this->fTimeZoneNames,tzCanonicalID,&location);
      }
      else {
        (*(this->fLocaleDisplayNames->super_UObject)._vptr_UObject[0xb])
                  (this->fLocaleDisplayNames,&status,&location);
      }
      UnicodeString::~UnicodeString(&name);
    }
    status = U_ZERO_ERROR;
    name.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268;
    name.fUnion.fStackFields.fLengthAndFlags = 2;
    SimpleFormatter::format(&this->fFallbackFormat,&location,mzDisplayName,&name,&status);
    if (status < U_ILLEGAL_ARGUMENT_ERROR) {
      key_00 = ZNStringPool::get(&this->fStringPool,&name,&status);
      if ((status < U_ILLEGAL_ARGUMENT_ERROR) &&
         (key_01 = (undefined8 *)uprv_malloc_63(0x18), key_01 != (undefined8 *)0x0)) {
        *key_01 = key.tzID;
        key_01[1] = key.mzID;
        *(UBool *)(key_01 + 2) = key.isLong;
        uhash_put_63(this->fPartialLocationNamesMap,key_01,key_00,&status);
        if (status < U_ILLEGAL_ARGUMENT_ERROR) {
          value = (int *)uprv_malloc_63(0x10);
          if (value != (int *)0x0) {
            *value = (uint)(isLong == '\0') * 2 + 2;
            *(UChar **)(value + 2) = key.tzID;
            TextTrieMap::put(&this->fGNamesTrie,key_00,value,&status);
          }
        }
        else {
          uprv_free_63(key_01);
        }
      }
    }
    else {
      key_00 = (UChar *)0x0;
    }
    UnicodeString::~UnicodeString(&name);
    UnicodeString::~UnicodeString(&usCountryCode);
    UnicodeString::~UnicodeString(&location);
  }
  return key_00;
}

Assistant:

const UChar*
TZGNCore::getPartialLocationName(const UnicodeString& tzCanonicalID,
                        const UnicodeString& mzID, UBool isLong, const UnicodeString& mzDisplayName) {
    U_ASSERT(!tzCanonicalID.isEmpty());
    U_ASSERT(!mzID.isEmpty());
    U_ASSERT(!mzDisplayName.isEmpty());

    PartialLocationKey key;
    key.tzID = ZoneMeta::findTimeZoneID(tzCanonicalID);
    key.mzID = ZoneMeta::findMetaZoneID(mzID);
    key.isLong = isLong;
    U_ASSERT(key.tzID != NULL && key.mzID != NULL);

    const UChar* uplname = (const UChar*)uhash_get(fPartialLocationNamesMap, (void *)&key);
    if (uplname != NULL) {
        return uplname;
    }

    UnicodeString location;
    UnicodeString usCountryCode;
    ZoneMeta::getCanonicalCountry(tzCanonicalID, usCountryCode);
    if (!usCountryCode.isEmpty()) {
        char countryCode[ULOC_COUNTRY_CAPACITY];
        U_ASSERT(usCountryCode.length() < ULOC_COUNTRY_CAPACITY);
        int32_t ccLen = usCountryCode.extract(0, usCountryCode.length(), countryCode, sizeof(countryCode), US_INV);
        countryCode[ccLen] = 0;

        UnicodeString regionalGolden;
        fTimeZoneNames->getReferenceZoneID(mzID, countryCode, regionalGolden);
        if (tzCanonicalID == regionalGolden) {
            // Use country name
            fLocaleDisplayNames->regionDisplayName(countryCode, location);
        } else {
            // Otherwise, use exemplar city name
            fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        }
    } else {
        fTimeZoneNames->getExemplarLocationName(tzCanonicalID, location);
        if (location.isEmpty()) {
            // This could happen when the time zone is not associated with a country,
            // and its ID is not hierarchical, for example, CST6CDT.
            // We use the canonical ID itself as the location for this case.
            location.setTo(tzCanonicalID);
        }
    }

    UErrorCode status = U_ZERO_ERROR;
    UnicodeString name;
    fFallbackFormat.format(location, mzDisplayName, name, status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    uplname = fStringPool.get(name, status);
    if (U_SUCCESS(status)) {
        // Add the name to cache
        PartialLocationKey* cacheKey = (PartialLocationKey *)uprv_malloc(sizeof(PartialLocationKey));
        if (cacheKey != NULL) {
            cacheKey->tzID = key.tzID;
            cacheKey->mzID = key.mzID;
            cacheKey->isLong = key.isLong;
            uhash_put(fPartialLocationNamesMap, (void *)cacheKey, (void *)uplname, &status);
            if (U_FAILURE(status)) {
                uprv_free(cacheKey);
            } else {
                // put the name to the local trie as well
                GNameInfo *nameinfo = (ZNameInfo *)uprv_malloc(sizeof(GNameInfo));
                if (nameinfo != NULL) {
                    nameinfo->type = isLong ? UTZGNM_LONG : UTZGNM_SHORT;
                    nameinfo->tzID = key.tzID;
                    fGNamesTrie.put(uplname, nameinfo, status);
                }
            }
        }
    }
    return uplname;
}